

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
          (View<int,false,std::allocator<unsigned_long>> *this,unsigned_long *bit,unsigned_long *sit
          ,View<int,_false,_std::allocator<unsigned_long>_> *out)

{
  runtime_error *this_00;
  size_t offset;
  allocator_type local_29;
  size_t local_28;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_28 = 0;
  coordinatesToOffset<unsigned_long*>(this,bit,&local_28);
  if (*(long *)this != 0) {
    assign<unsigned_long*,unsigned_long_const*>
              ((View<int,false,std::allocator<unsigned_long>> *)out,sit,sit + *(long *)(this + 0x28)
               ,*(unsigned_long **)(this + 0x20),(pointer)(*(long *)this + local_28 * 4),
               (CoordinateOrder *)(this + 0x38),&local_29);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    View<T, isConst, A>& out
) const
{
    view(bit, sit, coordinateOrder(), out);
}